

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

bool __thiscall HMatrix::setup_ok(HMatrix *this,int *nonbasicFlag_)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  
  puts("Checking row-wise matrix");
  bVar7 = this->numRow < 1;
  if (0 < this->numRow) {
    uVar9 = 0;
    do {
      uVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      uVar6 = (ulong)uVar1;
      iVar2 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      bVar4 = (int)uVar1 < iVar2;
      if ((int)uVar1 < iVar2) {
        uVar5 = (ulong)(int)uVar1;
        piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)piVar3[uVar5];
        if (nonbasicFlag_[lVar8] != 0) {
          do {
            if (iVar2 + -1 == (int)uVar5) goto LAB_00126b46;
            lVar8 = (long)piVar3[uVar5 + 1];
            uVar5 = uVar5 + 1;
          } while (nonbasicFlag_[lVar8] != 0);
          bVar4 = (long)uVar5 < (long)iVar2;
          uVar6 = uVar5 & 0xffffffff;
        }
        printf("Row-wise matrix error: col %d, (el = %d for row %d) is basic\n",lVar8,uVar6,
               uVar9 & 0xffffffff);
        if (bVar4) {
          return bVar7;
        }
      }
LAB_00126b46:
      uVar1 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      uVar6 = (ulong)uVar1;
      iVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9 + 1];
      bVar4 = (int)uVar1 < iVar2;
      if ((int)uVar1 < iVar2) {
        uVar5 = (ulong)(int)uVar1;
        piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)piVar3[uVar5];
        if (nonbasicFlag_[lVar8] == 0) {
          do {
            if (iVar2 + -1 == (int)uVar5) goto LAB_00126ba3;
            lVar8 = (long)piVar3[uVar5 + 1];
            uVar5 = uVar5 + 1;
          } while (nonbasicFlag_[lVar8] == 0);
          bVar4 = (long)uVar5 < (long)iVar2;
          uVar6 = uVar5 & 0xffffffff;
        }
        printf("Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n",lVar8,uVar6,
               uVar9 & 0xffffffff);
        if (bVar4) {
          return bVar7;
        }
      }
LAB_00126ba3:
      uVar9 = uVar9 + 1;
      bVar7 = (long)this->numRow <= (long)uVar9;
    } while ((long)uVar9 < (long)this->numRow);
  }
  return bVar7;
}

Assistant:

bool HMatrix::setup_ok(const int *nonbasicFlag_) {
  printf("Checking row-wise matrix\n");
  for (int row = 0; row < numRow; row++) {
    for (int el = ARstart[row]; el < AR_Nend[row]; el++) {
      int col = ARindex[el];
      if (!nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is basic\n", col, el, row);
	return false;
      }
    }
    for (int el = AR_Nend[row]; el < ARstart[row+1]; el++) {
      int col = ARindex[el];
      if (nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n", col, el, row);
	return false;
      }
    }
  }
  return true;
}